

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall
QAbstractItemViewPrivate::rowsInserted
          (QAbstractItemViewPrivate *this,QModelIndex *index,int start,int end)

{
  SizeAdjustPolicy SVar1;
  undefined8 uVar2;
  char cVar3;
  long in_FS_OFFSET;
  code *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  int local_40;
  undefined4 uStack_3c;
  int iStack_38;
  undefined4 uStack_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *(undefined8 *)
           &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
            field_0x8;
  cVar3 = QAccessible::isActive();
  if (cVar3 != '\0') {
    local_48 = 0x2ffffffff;
    local_60 = QIcon::QIcon;
    uStack_3c = 0xffffffff;
    uStack_34 = 0xffffffff;
    local_58 = 0xaaaaaaaa00000116;
    local_50 = uVar2;
    local_40 = start;
    iStack_38 = end;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_60);
    QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent
              ((QAccessibleTableModelChangeEvent *)&local_60);
  }
  SVar1 = (this->super_QAbstractScrollAreaPrivate).sizeAdjustPolicy;
  if ((SVar1 != AdjustIgnored) &&
     ((SVar1 == AdjustToContents || ((this->super_QAbstractScrollAreaPrivate).shownOnce == false))))
  {
    QWidget::updateGeometry
              (*(QWidget **)
                &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
                 field_0x8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::rowsInserted(const QModelIndex &index, int start, int end)
{
    Q_UNUSED(index);
    Q_UNUSED(start);
    Q_UNUSED(end);

#if QT_CONFIG(accessibility)
    Q_Q(QAbstractItemView);
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent accessibleEvent(q, QAccessibleTableModelChangeEvent::RowsInserted);
        accessibleEvent.setFirstRow(start);
        accessibleEvent.setLastRow(end);
        QAccessible::updateAccessibility(&accessibleEvent);
    }
#endif
    updateGeometry();
}